

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,RepeatLoopStatement *stmt)

{
  Expression *this_00;
  pointer p;
  DataFlowState *pDVar1;
  bool bVar2;
  DataFlowState *exitState;
  ConstantValue cv;
  DataFlowState currState;
  type oldBreakStates;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_388;
  DataFlowState local_360;
  DataFlowState local_2c0;
  DataFlowState local_220;
  SmallVector<slang::analysis::DataFlowState,_2UL> local_180;
  
  this_00 = stmt->count;
  bVar2 = this->inCondition;
  this->inCondition = true;
  ast::Expression::visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
            (this_00,this_00,(DataFlowAnalysis *)this);
  this->inCondition = bVar2;
  adjustConditionalState((ConstantValue *)&_Stack_388,this,this_00);
  unsplit(this);
  DataFlowAnalysis::copyState(&local_360,(DataFlowAnalysis *)this,&this->state);
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            (&local_180,&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            (&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->body,(DataFlowAnalysis *)this);
  bVar2 = ConstantValue::isTrue((ConstantValue *)&_Stack_388);
  if (bVar2) {
    exitState = &local_220;
    SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
              (&exitState->assigned,(Base *)&this->state);
    local_220.reachable = (this->state).reachable;
    loopTail(this,exitState,&local_180);
    pDVar1 = &local_220;
  }
  else {
    exitState = &local_2c0;
    SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
              (&exitState->assigned,(Base *)&local_360);
    local_2c0.reachable = local_360.reachable;
    loopTail(this,exitState,&local_180);
    pDVar1 = &local_2c0;
  }
  p = (pDVar1->assigned).
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_;
  if (p != (pointer)(pDVar1->assigned).
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    firstElement) {
    operator_delete(p);
  }
  SmallVectorBase<slang::analysis::DataFlowState>::cleanup
            (&local_180.super_SmallVectorBase<slang::analysis::DataFlowState>,
             (EVP_PKEY_CTX *)exitState);
  if (local_360.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_360.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_360.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_388);
  return;
}

Assistant:

void visitStmt(const RepeatLoopStatement& stmt) {
        auto cv = visitCondition(stmt.count);
        unsplit();

        auto currState = (DERIVED).copyState(state);
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        // If the repeat count is known to be positive we know the
        // body will execute at least once so we can keep our current
        // state; otherwise we need to join with the pre-loop state.
        if (cv.isTrue())
            loopTail(std::move(state), std::move(oldBreakStates));
        else
            loopTail(std::move(currState), std::move(oldBreakStates));
    }